

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscanf.c
# Opt level: O0

int vwscan_fn(WINPUTFN inputfn,char16_t_conflict *string,char16_t_conflict *format,
             __va_list_tag *arglist)

{
  size_t sVar1;
  int *piVar2;
  int _Expr_val_1;
  int _Expr_val;
  size_t count;
  int retval;
  miniFILE *infile;
  miniFILE str;
  __va_list_tag *arglist_local;
  char16_t_conflict *format_local;
  char16_t_conflict *string_local;
  WINPUTFN inputfn_local;
  
  str._24_8_ = arglist;
  sVar1 = wcsnlen((wchar_t *)string,0x7fffffff);
  if ((string == (char16_t_conflict *)0x0) && (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0)
     ) {
    (*sMBUSafeCRTAssertFunc)
              ("\"(string != NULL)\"","SafeCRT assert failed",
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/sscanf.c"
               ,0x79);
  }
  if (string != (char16_t_conflict *)0x0) {
    if ((format == (char16_t_conflict *)0x0) &&
       (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0)) {
      (*sMBUSafeCRTAssertFunc)
                ("\"(format != NULL)\"","SafeCRT assert failed",
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/sscanf.c"
                 ,0x7a);
    }
    if (format != (char16_t_conflict *)0x0) {
      str._base._0_4_ = 0xd;
      if (sVar1 < 0x40000000) {
        str._ptr._0_4_ = (int)sVar1 << 1;
      }
      else {
        str._ptr._0_4_ = 0x7fffffff;
      }
      infile = (miniFILE *)string;
      str._8_8_ = string;
      inputfn_local._4_4_ = (*inputfn)((miniFILE *)&infile,format,(__va_list_tag *)str._24_8_);
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0) {
        (*sMBUSafeCRTAssertFunc)
                  ("\"(format != NULL)\"","SafeCRT assert failed",
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/sscanf.c"
                   ,0x7a);
      }
      inputfn_local._4_4_ = -1;
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0) {
      (*sMBUSafeCRTAssertFunc)
                ("\"(string != NULL)\"","SafeCRT assert failed",
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/sscanf.c"
                 ,0x79);
    }
    inputfn_local._4_4_ = -1;
  }
  return inputfn_local._4_4_;
}

Assistant:

static int __cdecl vwscan_fn (
        WINPUTFN inputfn,
        const char16_t *string,
        const char16_t *format,
        va_list arglist
        )
{
        miniFILE str;
        miniFILE *infile = &str;
        int retval;
        size_t count = wcsnlen(string, INT_MAX);

        _VALIDATE_RETURN( (string != NULL), EINVAL, EOF);
        _VALIDATE_RETURN( (format != NULL), EINVAL, EOF);

        infile->_flag = _IOREAD|_IOSTRG|_IOMYBUF;
        infile->_ptr = infile->_base = (char *) string;

        if(count>(INT_MAX/sizeof(char16_t)))
        {
            /* old-style functions allow any large value to mean unbounded */
            infile->_cnt = INT_MAX;
        }
        else
        {
            infile->_cnt = (int)count*sizeof(char16_t);
        }

        retval = (inputfn(infile, format, arglist));

        return(retval);
}